

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this,
          CommonArgProperties<Catch::ConfigData> *param_2)

{
  long in_RSI;
  BoundArgFunction<Catch::ConfigData> *in_RDI;
  BoundArgFunction<Catch::ConfigData> *pBVar1;
  
  pBVar1 = in_RDI;
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction(in_RDI,in_RDI);
  std::__cxx11::string::string((string *)(pBVar1 + 1),(string *)(in_RSI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 5),(string *)(in_RSI + 0x28));
  std::__cxx11::string::string((string *)(in_RDI + 9),(string *)(in_RSI + 0x48));
  return;
}

Assistant:

CommonArgProperties() {}